

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::sendDisconnect(CommonCore *this,action_t disconnectType)

{
  FederateState *this_00;
  BaseTimeCoordinator *pBVar1;
  string_view message;
  FederateStates FVar2;
  string_view name;
  const_iterator __end1;
  ActionMessage disconnect;
  ActionMessage bye;
  
  if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
    message._M_str = "sending disconnect";
    message._M_len = 0x12;
    name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (&this->super_BrokerBase,
               (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,9,name,message,
               false);
  }
  checkInFlightQueriesForDisconnect(this);
  ActionMessage::ActionMessage(&bye,disconnectType);
  bye.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::begin
            ((const_iterator *)&disconnect,&(this->loopFederates).dataStorage);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
            (&__end1,&(this->loopFederates).dataStorage);
  while ((disconnect.dest_id.gid != __end1.offset || ((FedInfo **)disconnect._0_8_ != __end1.vec)))
  {
    this_00 = *(FederateState **)CONCAT44(disconnect.source_handle.hid,disconnect.source_id.gid);
    FVar2 = FederateState::getState(this_00);
    if (FVar2 != FINISHED) {
      bye.dest_id.gid = (this_00->global_id)._M_i.gid;
      FederateState::addAction(this_00,&bye);
    }
    if ((this->super_BrokerBase).hasTimeDependency == true) {
      pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (*pBVar1->_vptr_BaseTimeCoordinator[6])(pBVar1,(ulong)(uint)(this_00->global_id)._M_i.gid);
      pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (*pBVar1->_vptr_BaseTimeCoordinator[7])(pBVar1,(ulong)(uint)(this_00->global_id)._M_i.gid);
    }
    gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
    operator++((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
               &disconnect);
  }
  if ((this->super_BrokerBase).hasTimeDependency != false) {
    BaseTimeCoordinator::disconnect
              ((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
  }
  if (this->filterFed != (FilterFederate *)0x0) {
    FilterFederate::handleMessage(this->filterFed,&bye);
  }
  ActionMessage::ActionMessage(&disconnect,cmd_disconnect);
  disconnect.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  (*(this->super_Core)._vptr_Core[0x6b])(this,0);
  ActionMessage::~ActionMessage(&disconnect);
  ActionMessage::~ActionMessage(&bye);
  return;
}

Assistant:

void CommonCore::sendDisconnect(action_message_def::action_t disconnectType)
{
    LOG_CONNECTIONS(global_broker_id_local, identifier, "sending disconnect");
    checkInFlightQueriesForDisconnect();
    ActionMessage bye(disconnectType);
    bye.source_id = global_broker_id_local;
    for (auto fed : loopFederates) {
        if (fed->getState() != FederateStates::FINISHED) {
            bye.dest_id = fed->global_id;
            fed->addAction(bye);
        }
        if (hasTimeDependency) {
            timeCoord->removeDependency(fed->global_id);
            timeCoord->removeDependent(fed->global_id);
        }
    }
    if (hasTimeDependency) {
        timeCoord->disconnect();
    }
    if (filterFed != nullptr) {
        filterFed->handleMessage(bye);
    }
    ActionMessage disconnect(CMD_DISCONNECT);
    disconnect.source_id = global_broker_id_local;
    transmit(parent_route_id, disconnect);
}